

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.cpp
# Opt level: O1

string * __thiscall
mnf::Manifold::description
          (string *__return_storage_ptr__,Manifold *this,string *prefix,bool param_2)

{
  ostream *poVar1;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->name_)._M_dataplus._M_p,(this->name_)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string Manifold::description(const std::string& prefix, bool) const
{
  std::stringstream ss;
  ss << prefix << name() << std::endl;
  return ss.str();
}